

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O1

string * grpc_cpp_generator::anon_unknown_3::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filename->_M_string_length != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      iVar2 = isalnum((int)(filename->_M_dataplus)._M_p[uVar3]);
      cVar5 = (char)__return_storage_ptr__;
      if (iVar2 == 0) {
        std::__cxx11::string::push_back(cVar5);
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::push_back(cVar5);
      bVar1 = uVar4 < filename->_M_string_length;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static grpc::string FilenameIdentifier(const grpc::string &filename) {
  grpc::string result;
  for (unsigned i = 0; i < filename.size(); i++) {
    char c = filename[i];
    if (isalnum(c)) {
      result.push_back(c);
    } else {
      static char hex[] = "0123456789abcdef";
      result.push_back('_');
      result.push_back(hex[(c >> 4) & 0xf]);
      result.push_back(hex[c & 0xf]);
    }
  }
  return result;
}